

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O2

bool trt_pose::parse::munkresStep2(PairGraph *star_graph,CoverTable *cover_table)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int j;
  long lVar5;
  
  iVar1 = star_graph->nrows;
  iVar3 = star_graph->ncols;
  iVar4 = 0;
  iVar2 = iVar3;
  for (lVar5 = 0; lVar5 < iVar2; lVar5 = lVar5 + 1) {
    if (-1 < (star_graph->cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5]) {
      utils::CoverTable::coverCol(cover_table,(int)lVar5);
      iVar4 = iVar4 + 1;
      iVar2 = star_graph->ncols;
    }
  }
  if (iVar1 < iVar3) {
    iVar3 = iVar1;
  }
  return iVar3 <= iVar4;
}

Assistant:

bool munkresStep2(const PairGraph &star_graph, CoverTable &cover_table) {
  int k =
      star_graph.nrows < star_graph.ncols ? star_graph.nrows : star_graph.ncols;
  int count = 0;
  for (int j = 0; j < star_graph.ncols; j++) {
    if (star_graph.isColSet(j)) {
      cover_table.coverCol(j);
      count++;
    }
  }
  return count >= k;
}